

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNnameConstraintsTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section13InvalidDNnameConstraintsTest8
          (Section13InvalidDNnameConstraintsTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section13InvalidDNnameConstraintsTest8<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section13InvalidDNnameConstraintsTest8(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNnameConstraintsTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN4CACert",
                               "InvalidDNnameConstraintsTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN4CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.8";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}